

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PickLoadSigns.cpp
# Opt level: O1

void __thiscall wasm::PickLoadSigns::optimize(PickLoadSigns *this)

{
  pointer pUVar1;
  Index IVar2;
  Index IVar3;
  uint uVar4;
  pointer pUVar5;
  _Hash_node_base *p_Var6;
  
  p_Var6 = (this->loads)._M_h._M_before_begin._M_nxt;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    pUVar5 = (this->usages).
             super__Vector_base<wasm::PickLoadSigns::Usage,_std::allocator<wasm::PickLoadSigns::Usage>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      IVar2 = pUVar5[*(uint *)&p_Var6[2]._M_nxt].totalUsages;
      if (IVar2 != 0) {
        pUVar1 = pUVar5 + *(uint *)&p_Var6[2]._M_nxt;
        IVar3 = pUVar1->signedUsages;
        uVar4 = pUVar1->unsignedUsages;
        if ((((uVar4 + IVar3 == IVar2) &&
             ((IVar3 == 0 || (pUVar1->signedBits == (uint)*(byte *)&p_Var6[1]._M_nxt[2]._M_nxt << 3)
              ))) && ((uVar4 == 0 ||
                      (pUVar1->unsignedBits == (uint)*(byte *)&p_Var6[1]._M_nxt[2]._M_nxt << 3))))
           && (*(char *)&p_Var6[1]._M_nxt[5]._M_nxt == '\0')) {
          *(bool *)((long)&p_Var6[1]._M_nxt[2]._M_nxt + 1) = uVar4 <= IVar3 * 2;
        }
      }
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void optimize() {
    // optimize based on the info we saw
    for (auto& [load, index] : loads) {
      auto& usage = usages[index];
      // if we can't optimize, give up
      if (usage.totalUsages == 0 || // no usages, so no idea
          usage.signedUsages + usage.unsignedUsages !=
            usage.totalUsages || // non-sign/unsigned usages, so cannot change
          (usage.signedUsages != 0 &&
           usage.signedBits !=
             load->bytes * 8) || // sign usages exist but the wrong size
          (usage.unsignedUsages != 0 &&
           usage.unsignedBits !=
             load->bytes * 8)) { // unsigned usages exist but the wrong size
        continue;
      }
      // Atomic operations are always unsigned, never signed.
      if (load->isAtomic) {
        continue;
      }
      // we can pick the optimal one. our hope is to remove 2 items per
      // signed use (two shifts), so we factor that in
      load->signed_ = usage.signedUsages * 2 >= usage.unsignedUsages;
    }
  }